

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

_Bool btorsim_bv_is_umulo(BtorSimBitVector *a,BtorSimBitVector *b)

{
  ulong uVar1;
  BtorSimBitVector *a_00;
  BtorSimBitVector *b_00;
  BtorSimBitVector *bv;
  BtorSimBitVector *__ptr;
  ulong uVar2;
  ulong uVar3;
  _Bool _Var4;
  
  if (a->width < 2) {
    _Var4 = false;
  }
  else {
    a_00 = btorsim_bv_new(a->width * 2);
    memcpy((void *)((long)a_00 + (ulong)a->len * -4 + (ulong)a_00->len * 4 + 8),a + 1,
           (ulong)a->len * 4);
    b_00 = btorsim_bv_new(b->width * 2);
    memcpy((void *)((long)b_00 + (ulong)b->len * -4 + (ulong)b_00->len * 4 + 8),b + 1,
           (ulong)b->len * 4);
    bv = btorsim_bv_mul(a_00,b_00);
    __ptr = btorsim_bv_slice(bv,bv->width - 1,a->width);
    uVar2 = (ulong)__ptr->len;
    if (uVar2 == 0) {
      _Var4 = false;
    }
    else {
      _Var4 = true;
      if (__ptr[1].width == 0) {
        uVar1 = 1;
        do {
          uVar3 = uVar1;
          if (uVar2 == uVar3) break;
          uVar1 = uVar3 + 1;
        } while ((&__ptr[1].width)[uVar3] == 0);
        _Var4 = uVar3 < uVar2;
      }
    }
    free(a_00);
    free(b_00);
    free(bv);
    free(__ptr);
  }
  return _Var4;
}

Assistant:

bool
btorsim_bv_is_umulo (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  bool res;
  BtorSimBitVector *aext, *bext, *mul, *o;

  res = false;

  if (a->width > 1)
  {
    aext = btorsim_bv_uext (a, a->width);
    bext = btorsim_bv_uext (b, b->width);
    mul  = btorsim_bv_mul (aext, bext);
    o    = btorsim_bv_slice (mul, mul->width - 1, a->width);
    if (!btorsim_bv_is_zero (o)) res = true;
    free (aext);
    free (bext);
    free (mul);
    free (o);
  }

  return res;
}